

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
parse_h16_and_colon(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  undefined4 local_34;
  curi_status status;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  local_34 = parse_h16(uri,len,offset,settings,userData);
  if (local_34 == curi_status_success) {
    local_34 = parse_char(':',uri,len,offset,settings,userData);
  }
  return local_34;
}

Assistant:

static curi_status parse_h16_and_colon(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // h16_and_colon = h16 ":"
    curi_status status = curi_status_success;

    if (status == curi_status_success)
        status = parse_h16(uri, len, offset, settings, userData);

    if (status == curi_status_success)
        status = parse_char(':', uri, len, offset, settings, userData);

    return status;
}